

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_comparator.cpp
# Opt level: O1

int bidfx_public_api::price::subject::SubjectComparatorUtils::CompareQuantity(string *s1,string *s2)

{
  code *pcVar1;
  int iVar2;
  int *piVar3;
  undefined8 uVar4;
  double dVar5;
  undefined1 auVar6 [12];
  exception e;
  code *local_40;
  double local_38;
  
  iVar2 = CompareObject(s1,s2);
  if (iVar2 != 2) {
    return iVar2;
  }
  pcVar1 = (code *)(s1->_M_dataplus)._M_p;
  piVar3 = __errno_location();
  iVar2 = *piVar3;
  *piVar3 = 0;
  dVar5 = strtod((char *)pcVar1,(char **)&local_40);
  if (local_40 == pcVar1) {
    std::__throw_invalid_argument("stod");
    goto LAB_001b1ae8;
  }
  local_38 = dVar5;
  if (*piVar3 == 0) {
LAB_001b1a67:
    *piVar3 = iVar2;
  }
  else if (*piVar3 == 0x22) {
    std::__throw_out_of_range("stod");
    goto LAB_001b1a67;
  }
  pcVar1 = (code *)(s2->_M_dataplus)._M_p;
  iVar2 = *piVar3;
  *piVar3 = 0;
  dVar5 = strtod((char *)pcVar1,(char **)&local_40);
  if (local_40 == pcVar1) {
LAB_001b1ae8:
    auVar6 = std::__throw_invalid_argument("stod");
    uVar4 = auVar6._0_8_;
    if (*piVar3 == 0) {
      *piVar3 = iVar2;
    }
    if (auVar6._8_4_ == 1) {
      __cxa_get_exception_ptr(uVar4);
      local_40 = pthread_mutex_lock;
      __cxa_begin_catch(uVar4);
      iVar2 = std::__cxx11::string::compare((string *)s1);
      std::exception::~exception((exception *)&local_40);
      __cxa_end_catch();
      return iVar2;
    }
    _Unwind_Resume(uVar4);
  }
  if (*piVar3 != 0) {
    if (*piVar3 != 0x22) goto LAB_001b1aa8;
    dVar5 = (double)std::__throw_out_of_range("stod");
  }
  *piVar3 = iVar2;
LAB_001b1aa8:
  if (local_38 < dVar5) {
    return -1;
  }
  return -(uint)(local_38 != dVar5) & 1;
}

Assistant:

int SubjectComparatorUtils::CompareQuantity(const std::string& s1, const std::string& s2)
{
    int cmp = CompareObject(s1, s2);
    if (cmp != BOTH_NON_NULL) return cmp;
    try
    {
        double val1 = std::stod(s1);
        double val2 = std::stod(s2);

        if (val1 < val2) return -1;
        return val1 == val2 ? 0 : 1;
    }
    catch (std::exception e)
    {
        return s1.compare(s2);
    }
}